

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  uchar **dempar;
  char *pcVar3;
  char *pcVar4;
  Boolean BVar5;
  ostream *poVar6;
  uchar **g;
  uchar **b;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  GSFloodFill<unsigned_char> *pGVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  string iFileName;
  string oFileName;
  string dFileName;
  string XSDPath;
  Mat src;
  Mat dst;
  Mat diff;
  int local_280;
  long *local_270;
  Mat *local_268;
  long alStack_260 [10];
  char *local_210;
  char *local_208;
  char local_200;
  undefined7 uStack_1ff;
  uchar **local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  undefined1 *local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 *local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  void *local_188;
  undefined8 uStack_180;
  long local_178;
  _InputArray local_168;
  _OutputArray local_150 [4];
  _OutputArray local_f0 [4];
  Mat local_90 [96];
  
  local_210 = &local_200;
  local_208 = (char *)0x0;
  local_200 = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = (char *)0x0;
  local_1d8 = 0;
  local_1c8 = &local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8 = 0;
  cv::Mat::Mat((Mat *)local_150);
  cv::Mat::Mat((Mat *)local_f0);
  cv::Mat::Mat(local_90);
  local_1a8 = &local_198;
  local_1a0 = (char *)0x0;
  local_280 = 0;
  local_198 = 0;
  if (1 < argc) {
    local_280 = 0;
    iVar12 = 1;
    do {
      pcVar4 = local_1a0;
      pcVar3 = local_1c0;
      pcVar2 = local_1e0;
      pcVar14 = local_208;
      if (*argv[iVar12] == '-') {
        bVar1 = argv[iVar12][1];
        if (bVar1 < 0x6f) {
          if (bVar1 == 100) {
            pcVar14 = argv[(long)iVar12 + 1];
            strlen(pcVar14);
            std::__cxx11::string::_M_replace((ulong)&local_1c8,0,pcVar3,(ulong)pcVar14);
          }
          else {
            if (bVar1 != 0x69) {
              if (bVar1 == 0x68) {
                iVar12 = 0;
                printHelp();
              }
              else {
LAB_0010699d:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown switch.\n",0x10);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
                std::ostream::put(-0x80);
                std::ostream::flush();
                iVar12 = -1;
                printHelp();
              }
              goto LAB_001068c0;
            }
            pcVar2 = argv[(long)iVar12 + 1];
            strlen(pcVar2);
            std::__cxx11::string::_M_replace((ulong)&local_210,0,pcVar14,(ulong)pcVar2);
          }
        }
        else if (bVar1 == 0x6f) {
          pcVar14 = argv[(long)iVar12 + 1];
          strlen(pcVar14);
          std::__cxx11::string::_M_replace((ulong)&local_1e8,0,pcVar2,(ulong)pcVar14);
        }
        else {
          if (bVar1 == 0x76) {
            local_280 = 1;
            goto LAB_0010631c;
          }
          if (bVar1 != 0x78) goto LAB_0010699d;
          pcVar14 = argv[(long)iVar12 + 1];
          strlen(pcVar14);
          std::__cxx11::string::_M_replace((ulong)&local_1a8,0,pcVar4,(ulong)pcVar14);
        }
        iVar12 = iVar12 + 1;
      }
LAB_0010631c:
      iVar12 = iVar12 + 1;
    } while (iVar12 < argc);
  }
  if (local_208 == (char *)0x0) {
    iVar12 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Option -i <filename> must be present! Aborting...\n",0x32);
  }
  else {
    if (local_1e0 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Option -o <filename> is missing. Output file name is set to \'output.jpg\'\n",0x49
                );
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,local_1e0,0x109456);
    }
    cv::imread((string *)&local_270,(int)&local_210);
    cv::Mat::operator=((Mat *)local_150,(Mat *)&local_270);
    cv::Mat::~Mat((Mat *)&local_270);
    local_270 = alStack_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Input image","");
    cv::namedWindow((string *)&local_270,1);
    if (local_270 != alStack_260) {
      operator_delete(local_270,alStack_260[0] + 1);
    }
    local_270 = alStack_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Input image","");
    local_168.sz.width = 0;
    local_168.sz.height = 0;
    local_168.flags = 0x1010000;
    local_168.obj = (Mat *)local_150;
    cv::imshow((string *)&local_270,&local_168);
    if (local_270 != alStack_260) {
      operator_delete(local_270,alStack_260[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_210,(long)local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," consists of ",0xd);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,((uint)local_150[0].super__InputArray.flags >> 3 & 0x1ff) + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," channels and ",0xe);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_150[0].super__InputArray.obj._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_150[0].super__InputArray.obj);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," pixels.\n",9);
    alStack_260[0] = 0;
    local_270 = (long *)CONCAT44(local_270._4_4_,0x2010000);
    local_268 = (Mat *)local_f0;
    cv::Mat::copyTo(local_150);
    lVar15 = (long)local_150[0].super__InputArray.obj._4_4_;
    lVar13 = (long)(int)local_150[0].super__InputArray.obj;
    uVar16 = 0xffffffffffffffff;
    if (-1 < lVar13) {
      uVar16 = lVar13 * 8;
    }
    local_1f0 = (uchar **)operator_new__(uVar16);
    g = (uchar **)operator_new__(uVar16);
    b = (uchar **)operator_new__(uVar16);
    uVar16 = (ulong)(local_150[0].super__InputArray.obj._4_4_ *
                    (int)local_150[0].super__InputArray.obj);
    puVar7 = (uchar *)operator_new__(uVar16);
    puVar8 = (uchar *)operator_new__(uVar16);
    puVar9 = (uchar *)operator_new__(uVar16);
    dempar = local_1f0;
    if (0 < (int)local_150[0].super__InputArray.obj) {
      lVar11 = 0;
      do {
        local_1f0[lVar11] = puVar7;
        lVar11 = lVar11 + 1;
        puVar7 = puVar7 + lVar15;
      } while (lVar13 != lVar11);
    }
    if (0 < (int)local_150[0].super__InputArray.obj) {
      lVar11 = 0;
      do {
        g[lVar11] = puVar8;
        lVar11 = lVar11 + 1;
        puVar8 = puVar8 + lVar15;
      } while (lVar13 != lVar11);
    }
    if (0 < (int)local_150[0].super__InputArray.obj) {
      lVar11 = 0;
      do {
        b[lVar11] = puVar9;
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + lVar15;
      } while (lVar13 != lVar11);
    }
    fromMat2RGB((Mat *)local_150,local_1f0,g,b);
    pGVar10 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
    GSFloodFill<unsigned_char>::GSFloodFill
              (pGVar10,dempar,(int)local_150[0].super__InputArray.obj,
               local_150[0].super__InputArray.obj._4_4_);
    pGVar10->verbose = local_280;
    BVar5 = GSFloodFill<unsigned_char>::Transform(pGVar10);
    if (BVar5) {
      GSFloodFill<unsigned_char>::~GSFloodFill(pGVar10);
      operator_delete(pGVar10,0xa0);
      pGVar10 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
      GSFloodFill<unsigned_char>::GSFloodFill
                (pGVar10,g,(int)local_150[0].super__InputArray.obj,
                 local_150[0].super__InputArray.obj._4_4_);
      pGVar10->verbose = local_280;
      BVar5 = GSFloodFill<unsigned_char>::Transform(pGVar10);
      if (BVar5) {
        GSFloodFill<unsigned_char>::~GSFloodFill(pGVar10);
        operator_delete(pGVar10,0xa0);
        pGVar10 = (GSFloodFill<unsigned_char> *)operator_new(0xa0);
        GSFloodFill<unsigned_char>::GSFloodFill
                  (pGVar10,b,(int)local_150[0].super__InputArray.obj,
                   local_150[0].super__InputArray.obj._4_4_);
        pGVar10->verbose = local_280;
        BVar5 = GSFloodFill<unsigned_char>::Transform(pGVar10);
        if (BVar5) {
          GSFloodFill<unsigned_char>::~GSFloodFill(pGVar10);
          operator_delete(pGVar10,0xa0);
          fromRGB2Mat((Mat *)local_f0,dempar,g,b);
          local_270 = alStack_260;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"Flood-filled image","");
          cv::namedWindow((string *)&local_270,1);
          if (local_270 != alStack_260) {
            operator_delete(local_270,alStack_260[0] + 1);
          }
          local_270 = alStack_260;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"Flood-filled image","");
          local_168.sz.width = 0;
          local_168.sz.height = 0;
          local_168.flags = 0x1010000;
          local_168.obj = (Mat *)local_f0;
          cv::imshow((string *)&local_270,&local_168);
          if (local_270 != alStack_260) {
            operator_delete(local_270,alStack_260[0] + 1);
          }
          local_270 = alStack_260;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"FloodFilled.jpg","")
          ;
          local_168.sz.width = 0;
          local_168.sz.height = 0;
          local_168.flags = 0x1010000;
          local_178 = 0;
          local_188 = (void *)0x0;
          uStack_180 = 0;
          local_168.obj = (Mat *)local_f0;
          cv::imwrite((string *)&local_270,&local_168,(vector *)&local_188);
          if (local_188 != (void *)0x0) {
            operator_delete(local_188,local_178 - (long)local_188);
          }
          if (local_270 != alStack_260) {
            operator_delete(local_270,alStack_260[0] + 1);
          }
          if (local_1c0 != (char *)0x0) {
            alStack_260[0] = 0;
            local_270 = (long *)CONCAT44(local_270._4_4_,0x2010000);
            local_268 = local_90;
            cv::Mat::copyTo(local_f0);
            BVar5 = diffMat(local_90,(Mat *)local_150);
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
            }
            cv::Mat::~Mat(local_90);
            cv::Mat::~Mat((Mat *)local_f0);
            cv::Mat::~Mat((Mat *)local_150);
            if (local_1c8 != &local_1b8) {
              operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
            }
            if (local_1e8 != &local_1d8) {
              operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
            }
            if (local_210 != &local_200) {
              operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
            }
            _Unwind_Resume(BVar5);
          }
          iVar12 = 0;
          cv::waitKey(0);
          goto LAB_001068c0;
        }
        pcVar14 = "floodFill.Transform (b) has failed! Aborting...\n";
      }
      else {
        pcVar14 = "floodFill.Transform (g) has failed! Aborting...\n";
      }
    }
    else {
      pcVar14 = "floodFill.Transform (r) has failed! Aborting...\n";
    }
    iVar12 = -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,0x30);
  }
LAB_001068c0:
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_150);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  return iVar12;
}

Assistant:

int main(int argc, char *argv[])
{
	int i, j;
	string iFileName;
	string oFileName;
	string dFileName;
	Mat src, dst, diff;
	string XSDPath;
	int rows, cols;
	Boolean error;
	int verbose;

	verbose=0;
	// manage command-line args
	if (argc>1)
	for (i=1; i<argc; i++)
		if (argv[i][0] == '-')
		switch(argv[i][1]) {
		case 'v': verbose=1; break;
		case 'h': printHelp(); return 0;
		case 'i': iFileName = argv[++i]; break;
		case 'o': oFileName = argv[++i]; break;
		case 'd': dFileName = argv[++i]; break;
		case 'x': XSDPath = argv[++i]; break;

		default: std::cerr << "Unknown switch.\n" << std::endl;
				 printHelp();
				 return -1;
		}



	if (iFileName.empty()) {
		std::cerr << "Option -i <filename> must be present! Aborting...\n";
		return -1;
	}
	if (oFileName.empty()) {
		std::cerr << "Option -o <filename> is missing. Output file name is set to 'output.jpg'\n";
		oFileName = "output.jpg";
	}

	src = imread(iFileName, cv::IMREAD_COLOR);
	namedWindow("Input image", CV_WINDOW_AUTOSIZE );
	imshow("Input image", src );

	std::cout << "Image " << iFileName << " consists of " << src.channels() << " channels and "
		<< src.cols << "x" << src.rows << " pixels.\n";

	//dst = imread(iFileName, CV_LOAD_IMAGE_COLOR); //src.clone();
	src.copyTo(dst);

	cols = src.cols;
	rows = src.rows;

	unsigned char **r, **g, **b;
	unsigned char *buffr, *buffg, *buffb;

	r = new unsigned char *[rows];
	g = new unsigned char *[rows];
	b = new unsigned char *[rows];

	buffr = new unsigned char[ cols * rows ];
	buffg = new unsigned char[ cols * rows ];
	buffb = new unsigned char[ cols * rows ];

	for (int i=0, disp=0; i<rows; i++, disp += cols)
		r[i] = & buffr[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		g[i] = & buffg[disp];
	for (int i=0, disp=0; i<rows; i++, disp += cols)
		b[i] = & buffb[disp];

	fromMat2RGB(src, r, g, b);

	/*
	unsigned char *origr, *origg, *origb;
	if (! dFileName.empty()) {
		origr = new unsigned char[ cols * rows ];
		origg = new unsigned char[ cols * rows ];
		origb = new unsigned char[ cols * rows ];
		int rxc = rows*cols;
		for (i=0; i<rxc; i++) {
			origr[i] = buffr[i];
			origg[i] = buffg[i];
			origb[i] = buffb[i];
		}
	}
	*/

	GSFloodFill<unsigned char> *floodFill;


	floodFill = new GSFloodFill<unsigned char>(r, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (r) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(g, rows, cols);
	//GSFloodFill<unsigned char> floodFill(g, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (g) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;

	floodFill = new GSFloodFill<unsigned char>(b, rows, cols);
	//GSFloodFill<unsigned char> floodFill(b, rows, cols);
	floodFill->setVerbose(verbose);
	if (! floodFill->Transform()) {
		std::cerr << "floodFill.Transform (b) has failed! Aborting...\n";
		return -1;
	}
	delete floodFill;


	// Now r, g and b point to the flood-filled transformation of the three input bands

	// (r,g,b) => dst
	fromRGB2Mat(dst, r, g, b);

	namedWindow( "Flood-filled image", CV_WINDOW_AUTOSIZE );
	imshow("Flood-filled image", dst );

	imwrite("FloodFilled.jpg", dst );



	if (! dFileName.empty()) {
		dst.copyTo(diff);
		diffMat(diff, src);

		namedWindow( "Difference image", CV_WINDOW_AUTOSIZE );
		imshow("Difference image", diff );
		imwrite("Difference.jpg", diff );
	}

	waitKey(0);
	return 0;
}